

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

void __thiscall psy::C::Parser::parsePredefinedName_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ostream *poVar3;
  PredefinedNameSyntax *pPVar4;
  IndexType IVar5;
  PredefinedNameSyntax *predefExpr;
  SyntaxToken local_58;
  ExpressionSyntax **local_18;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  local_18 = expr;
  expr_local = (ExpressionSyntax **)this;
  pSVar2 = peek(this,1);
  local_58.field_10 = pSVar2->field_10;
  local_58.tree_ = pSVar2->tree_;
  local_58.syntaxK_ = pSVar2->syntaxK_;
  local_58.byteSize_ = pSVar2->byteSize_;
  local_58.charSize_ = pSVar2->charSize_;
  local_58._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
  local_58.byteOffset_ = pSVar2->byteOffset_;
  local_58.charOffset_ = pSVar2->charOffset_;
  local_58.matchingBracket_ = pSVar2->matchingBracket_;
  local_58.field_7 = pSVar2->field_7;
  local_58._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
  local_58.lineno_ = pSVar2->lineno_;
  local_58.column_ = pSVar2->column_;
  local_58._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
  bVar1 = SyntaxFacts::isPredefinedSyntax(&local_58);
  SyntaxToken::~SyntaxToken(&local_58);
  if (bVar1) {
    pPVar4 = makeNode<psy::C::PredefinedNameSyntax>(this);
    *local_18 = (ExpressionSyntax *)pPVar4;
    IVar5 = consume(this);
    pPVar4->identTkIdx_ = IVar5;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6d);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: <predefined-name>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Parser::parsePredefinedName_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(SyntaxFacts::isPredefinedSyntax(peek()),
                  return,
                  "assert failure: <predefined-name>");

    auto predefExpr = makeNode<PredefinedNameSyntax>();
    expr = predefExpr;
    predefExpr->identTkIdx_ = consume();
}